

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setIntegerProperty
          (CommonCore *this,LocalFederateId federateID,int32_t property,int16_t propertyValue)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  GlobalBrokerId id;
  undefined8 uVar2;
  FederateState *pFVar3;
  char *__str;
  FederateState *in_RDI;
  ActionMessage cmd;
  FederateState *fed;
  ActionMessage cmd_1;
  undefined4 in_stack_fffffffffffffdf8;
  int32_t in_stack_fffffffffffffdfc;
  BrokerBase *in_stack_fffffffffffffe00;
  ActionMessage *this_00;
  char *in_stack_fffffffffffffe08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  action_t in_stack_fffffffffffffe1c;
  undefined4 uVar4;
  CommonCore *in_stack_fffffffffffffe38;
  LocalFederateId in_stack_fffffffffffffe44;
  GlobalFederateId local_ec [5];
  BaseType local_d8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  LocalFederateId local_4;
  
  uVar5 = 0xfffffefd;
  bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    bVar1 = waitCoreRegistration((CommonCore *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x28);
      uVar5 = (undefined4)uVar2;
      uVar4 = (undefined4)((ulong)uVar2 >> 0x20);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      message._M_len._4_4_ = uVar4;
      message._M_len._0_4_ = uVar5;
      message._M_str = (char *)in_RDI;
      FunctionExecutionFailure::FunctionExecutionFailure
                ((FunctionExecutionFailure *)in_stack_fffffffffffffe10,message);
      __cxa_throw(CONCAT44(uVar4,uVar5),&FunctionExecutionFailure::typeinfo,
                  FunctionExecutionFailure::~FunctionExecutionFailure);
    }
    ActionMessage::ActionMessage((ActionMessage *)in_RDI,in_stack_fffffffffffffe1c);
    id = CLI::std::atomic<helics::GlobalBrokerId>::load
                   ((atomic<helics::GlobalBrokerId> *)&(in_RDI->name).field_2,seq_cst);
    GlobalFederateId::GlobalFederateId(local_ec,id);
    local_d8 = local_ec[0].gid;
    ActionMessage::setExtraData
              ((ActionMessage *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    BrokerBase::addActionMessage
              (in_stack_fffffffffffffe00,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe00);
  }
  else {
    pFVar3 = getFederateAt(in_stack_fffffffffffffe38,in_stack_fffffffffffffe44);
    if (pFVar3 == (FederateState *)0x0) {
      __str = (char *)__cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe10,__str);
      message_00._M_len._4_4_ = in_stack_fffffffffffffe1c;
      message_00._M_len._0_4_ = in_stack_fffffffffffffe18;
      message_00._M_str = (char *)in_RDI;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffe10,message_00);
      __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    this_00 = (ActionMessage *)&stack0xfffffffffffffe28;
    ActionMessage::ActionMessage((ActionMessage *)in_RDI,in_stack_fffffffffffffe1c);
    ActionMessage::setExtraData(this_00,in_stack_fffffffffffffdfc);
    FederateState::setProperties
              (in_RDI,(ActionMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
              );
    ActionMessage::~ActionMessage(this_00);
  }
  return;
}

Assistant:

void CommonCore::setIntegerProperty(LocalFederateId federateID,
                                    int32_t property,
                                    int16_t propertyValue)
{
    if (federateID == gLocalCoreId) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, property was not set"));
        }
        ActionMessage cmd(CMD_CORE_CONFIGURE);
        cmd.dest_id = global_id.load();
        cmd.messageID = property;
        cmd.setExtraData(propertyValue);
        addActionMessage(cmd);
        return;
    }
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (getMaximumIterations)"));
    }
    ActionMessage cmd(CMD_FED_CONFIGURE_INT);
    cmd.messageID = property;
    cmd.setExtraData(propertyValue);
    fed->setProperties(cmd);
}